

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O3

SyntaxKind __thiscall
slang::parsing::LexerFacts::getDirectiveKind
          (LexerFacts *this,string_view directive,bool enableLegacyProtect)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  size_t __n;
  char *__s1;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong *puVar17;
  long *plVar18;
  long lVar19;
  long *plVar20;
  size_type __rlen;
  undefined1 *this_00;
  bool bVar21;
  undefined1 auVar22 [16];
  size_t pos;
  value_type *elements;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)directive._M_len;
  this_00 = directiveTable;
  bVar21 = (int)directive._M_str != 0;
  if (bVar21) {
    this_00 = &directivesWithLegacyProtect;
  }
  plVar18 = (long *)(directiveTable + 0x10);
  if (bVar21) {
    plVar18 = &DAT_00cb2b90;
  }
  plVar20 = (long *)(directiveTable + 0x18);
  if (bVar21) {
    plVar20 = &DAT_00cb2b98;
  }
  puVar17 = (ulong *)(directiveTable + 8);
  if (bVar21) {
    puVar17 = &DAT_00cb2b88;
  }
  local_40._M_len = (size_t)this;
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00,
                      &local_40);
  __s1 = local_40._M_str;
  __n = local_40._M_len;
  uVar14 = uVar13 >> (*this_00 & 0x3f);
  lVar3 = *plVar18;
  lVar1 = (uVar13 & 0xff) * 4;
  cVar7 = (&UNK_0092f4ac)[lVar1];
  cVar8 = (&UNK_0092f4ad)[lVar1];
  cVar9 = (&UNK_0092f4ae)[lVar1];
  bVar10 = (&UNK_0092f4af)[lVar1];
  lVar1 = *plVar20;
  uVar4 = *puVar17;
  uVar16 = 0;
  do {
    pcVar2 = (char *)(lVar3 + uVar14 * 0x10);
    bVar6 = pcVar2[0xf];
    auVar22[0] = -(*pcVar2 == cVar7);
    auVar22[1] = -(pcVar2[1] == cVar8);
    auVar22[2] = -(pcVar2[2] == cVar9);
    auVar22[3] = -(pcVar2[3] == bVar10);
    auVar22[4] = -(pcVar2[4] == cVar7);
    auVar22[5] = -(pcVar2[5] == cVar8);
    auVar22[6] = -(pcVar2[6] == cVar9);
    auVar22[7] = -(pcVar2[7] == bVar10);
    auVar22[8] = -(pcVar2[8] == cVar7);
    auVar22[9] = -(pcVar2[9] == cVar8);
    auVar22[10] = -(pcVar2[10] == cVar9);
    auVar22[0xb] = -(pcVar2[0xb] == bVar10);
    auVar22[0xc] = -(pcVar2[0xc] == cVar7);
    auVar22[0xd] = -(pcVar2[0xd] == cVar8);
    auVar22[0xe] = -(pcVar2[0xe] == cVar9);
    auVar22[0xf] = -(bVar6 == bVar10);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar15 = lVar1 + uVar14 * 0x168;
      do {
        uVar5 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        lVar19 = (ulong)uVar5 * 0x18;
        if (((LexerFacts *)__n == *(LexerFacts **)(lVar15 + lVar19)) &&
           (((LexerFacts *)__n == (LexerFacts *)0x0 ||
            (iVar11 = bcmp(__s1,*(void **)(lVar15 + 8 + lVar19),__n), iVar11 == 0)))) {
          return *(SyntaxKind *)(lVar15 + lVar19 + 0x10);
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar6) == 0) {
      return MacroUsage;
    }
    lVar15 = uVar14 + uVar16;
    uVar16 = uVar16 + 1;
    uVar14 = lVar15 + 1U & uVar4;
  } while (uVar16 <= uVar4);
  return MacroUsage;
}

Assistant:

SyntaxKind LexerFacts::getDirectiveKind(std::string_view directive, bool enableLegacyProtect) {
    auto& table = enableLegacyProtect ? directivesWithLegacyProtect : directiveTable;
    if (auto it = table.find(directive); it != table.end())
        return it->second;
    return SyntaxKind::MacroUsage;
}